

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O3

void __thiscall cmInstallFilesCommand::FinalPass(cmInstallFilesCommand *this)

{
  string *regexp;
  size_type sVar1;
  long *plVar2;
  string *psVar3;
  ulong *puVar4;
  size_type *psVar5;
  undefined8 uVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  pointer pbVar9;
  string *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string testf;
  undefined1 local_108 [40];
  string local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string *local_a0;
  string local_98;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  if (this->IsFilesForm == false) {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    regexp = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)psVar3 - (long)regexp) < 0x21) {
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      cmSystemTools::Glob(psVar3,regexp,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_108);
      if (local_108._0_8_ != local_108._8_8_) {
        pbVar9 = (pointer)local_108._0_8_;
        do {
          FindInstallSource_abi_cxx11_(&local_e0,this,(pbVar9->_M_dataplus)._M_p);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->Files,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != (pointer)local_108._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
    }
    else {
      filename = regexp + 1;
      local_a0 = regexp;
      if (filename != psVar3) {
        local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
        ;
        do {
          cmsys::SystemTools::GetFilenamePath(&local_e0,filename);
          sVar1 = local_e0._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (sVar1 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_108,filename);
            plVar2 = (long *)std::__cxx11::string::_M_append
                                       (local_108,(ulong)(local_a0->_M_dataplus)._M_p);
            psVar5 = (size_type *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_e0.field_2._M_allocated_capacity = *psVar5;
              local_e0.field_2._8_8_ = plVar2[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar5;
              local_e0._M_dataplus._M_p = (pointer)*plVar2;
            }
            local_e0._M_string_length = plVar2[1];
            *plVar2 = (long)psVar5;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            uVar6 = local_108._16_8_;
            _Var8._M_p = (pointer)local_108._0_8_;
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) goto LAB_00234f0d;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_50,filename);
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
            puVar4 = (ulong *)(plVar2 + 2);
            if ((ulong *)*plVar2 == puVar4) {
              local_b0 = *puVar4;
              lStack_a8 = plVar2[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *puVar4;
              local_c0 = (ulong *)*plVar2;
            }
            local_b8 = plVar2[1];
            *plVar2 = (long)puVar4;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_98,filename);
            uVar7 = 0xf;
            if (local_c0 != &local_b0) {
              uVar7 = local_b0;
            }
            if (uVar7 < local_98._M_string_length + local_b8) {
              uVar6 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                uVar6 = local_98.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar6 < local_98._M_string_length + local_b8) goto LAB_00234d5d;
              plVar2 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_c0);
            }
            else {
LAB_00234d5d:
              plVar2 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_c0,(ulong)local_98._M_dataplus._M_p);
            }
            local_108._0_8_ = local_108 + 0x10;
            pbVar9 = (pointer)(plVar2 + 2);
            if ((pointer)*plVar2 == pbVar9) {
              local_108._16_8_ = (pbVar9->_M_dataplus)._M_p;
              local_108._24_8_ = plVar2[3];
            }
            else {
              local_108._16_8_ = (pbVar9->_M_dataplus)._M_p;
              local_108._0_8_ = (pointer)*plVar2;
            }
            local_108._8_8_ = plVar2[1];
            *plVar2 = (long)pbVar9;
            plVar2[1] = 0;
            *(undefined1 *)&(pbVar9->_M_dataplus)._M_p = 0;
            plVar2 = (long *)std::__cxx11::string::_M_append
                                       (local_108,(ulong)(local_a0->_M_dataplus)._M_p);
            psVar5 = (size_type *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_e0.field_2._M_allocated_capacity = *psVar5;
              local_e0.field_2._8_8_ = plVar2[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar5;
              local_e0._M_dataplus._M_p = (pointer)*plVar2;
            }
            local_e0._M_string_length = plVar2[1];
            *plVar2 = (long)psVar5;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            uVar6 = local_50.field_2._M_allocated_capacity;
            _Var8._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00234f0d:
              operator_delete(_Var8._M_p,(ulong)((long)&(((pointer)uVar6)->_M_dataplus)._M_p + 1));
            }
          }
          FindInstallSource_abi_cxx11_(&local_e0,this,local_78);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_58,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          filename = filename + 1;
        } while (filename !=
                 (this->FinalArgs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    CreateInstallGenerator(this);
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return;
}

Assistant:

void cmInstallFilesCommand::FinalPass()
{
  // No final pass for "FILES" form of arguments.
  if (this->IsFilesForm) {
    return;
  }

  std::string testf;
  std::string const& ext = this->FinalArgs[0];

  // two different options
  if (this->FinalArgs.size() > 1) {
    // now put the files into the list
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    ++s;
    // for each argument, get the files
    for (; s != this->FinalArgs.end(); ++s) {
      // replace any variables
      std::string const& temps = *s;
      if (!cmSystemTools::GetFilenamePath(temps).empty()) {
        testf = cmSystemTools::GetFilenamePath(temps) + "/" +
          cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
      } else {
        testf = cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
      }

      // add to the result
      this->Files.push_back(this->FindInstallSource(testf.c_str()));
    }
  } else // reg exp list
  {
    std::vector<std::string> files;
    std::string const& regex = this->FinalArgs[0];
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(), regex,
                        files);

    std::vector<std::string>::iterator s = files.begin();
    // for each argument, get the files
    for (; s != files.end(); ++s) {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
    }
  }

  this->CreateInstallGenerator();
}